

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invoke.cpp
# Opt level: O0

void am_invoke_ok_proc(Am_Object *cmd)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Value *pAVar3;
  char *s;
  ostream *poVar4;
  Am_Wrapper *pAVar5;
  Am_Object local_820;
  Am_Object local_818;
  ostrstream local_810 [8];
  ostrstream oss_2;
  char local_6a8 [8];
  char line_2 [250];
  Am_Object local_5a0;
  Am_Object match_command;
  undefined1 local_590 [8];
  Am_Value before_after;
  ostrstream local_570 [8];
  ostrstream oss_1;
  char local_408 [8];
  char line_1 [250];
  ostrstream local_300 [8];
  ostrstream oss;
  char local_198 [8];
  char line [250];
  Am_Object local_88;
  Am_Object other_cmd;
  Am_Object local_78;
  Am_Input_Char local_6c;
  Am_Input_Char accel_char;
  Am_String local_60;
  Am_String accel_string;
  Am_Object script_execute_command;
  Am_Object window;
  Am_Object sel_widget;
  Am_Object undo_db;
  Am_Object script_window;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object invoke_window;
  Am_Object *cmd_local;
  
  invoke_window.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar3 = Am_Object::Get(&local_18,Am_SCRIPT_WINDOW,0);
  Am_Object::Am_Object(&undo_db,pAVar3);
  pAVar3 = Am_Object::Get(&undo_db,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object(&sel_widget,pAVar3);
  pAVar3 = Am_Object::Get(&sel_widget,0x197,0);
  Am_Object::Am_Object(&window,pAVar3);
  pAVar3 = Am_Object::Get(&window,0x68,0);
  Am_Object::Am_Object(&script_execute_command,pAVar3);
  pAVar3 = Am_Object::Get(&undo_db,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object((Am_Object *)&accel_string,pAVar3);
  Am_Object::Get_Object((Am_Object *)&stack0xffffffffffffff98,(Am_Slot_Key)&local_18,0x152);
  pAVar3 = Am_Object::Get((Am_Object *)&stack0xffffffffffffff98,0x169,0);
  Am_String::Am_String(&local_60,pAVar3);
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff98);
  Am_Input_Char::Am_Input_Char(&local_6c,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  Am_Object::Get_Object(&local_78,(Am_Slot_Key)&local_18,(ulong)Am_DO_ACCELERATOR);
  pAVar3 = Am_Object::Get(&local_78,0x169,0);
  bVar2 = Am_Value::Valid(pAVar3);
  Am_Object::~Am_Object(&local_78);
  if (bVar2) {
    bVar2 = Am_String::operator!=(&local_60,"");
    if (!bVar2) {
      std::ostrstream::ostrstream(local_570,local_408,0xfa,_S_out);
      poVar4 = std::operator<<((ostream *)local_570,"To attach to accelerator, need to fill in key")
      ;
      std::ostream::operator<<(poVar4,std::ends<char,std::char_traits<char>>);
      Am_Pop_Up_Error_Window(local_408);
      std::ostrstream::~ostrstream(local_570);
      goto LAB_002b3e4e;
    }
    s = Am_String::operator_cast_to_char_(&local_60);
    Am_Input_Char::Am_Input_Char((Am_Input_Char *)((long)&other_cmd.data + 4),s,false);
    Am_Input_Char::operator=(&local_6c,(Am_Input_Char *)((long)&other_cmd.data + 4));
    Am_Object::Am_Object((Am_Object *)(line + 0xf8),&script_execute_command);
    Am_Check_Accelerator_Char_For_Window(SUB84(&local_88,0),(Am_Object *)(ulong)(uint)local_6c);
    Am_Object::~Am_Object((Am_Object *)(line + 0xf8));
    bVar2 = Am_Object::Valid(&local_88);
    if ((bVar2) && (bVar2 = Am_Object::operator!=(&local_88,(Am_Object *)&accel_string), bVar2)) {
      std::ostrstream::ostrstream(local_300,local_198,0xfa,_S_out);
      poVar4 = std::operator<<((ostream *)local_300,"Accelerator ");
      poVar4 = operator<<(poVar4,&local_6c);
      poVar4 = std::operator<<(poVar4," already in use by ");
      poVar4 = operator<<(poVar4,&local_88);
      std::ostream::operator<<(poVar4,std::ends<char,std::char_traits<char>>);
      Am_Pop_Up_Error_Window(local_198);
      std::ostrstream::~ostrstream(local_300);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    Am_Object::~Am_Object(&local_88);
    if (bVar2) goto LAB_002b3e4e;
  }
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&before_after.value.float_value);
  Am_Object::Set((Am_Object *)&accel_string,0x152,(Am_Value *)&before_after.value,0);
  Am_Value::~Am_Value((Am_Value *)&before_after.value);
  Am_Object::Get_Object(&match_command,(Am_Slot_Key)&local_18,(ulong)Am_BEFORE_OR_AFTER);
  pAVar3 = Am_Object::Get(&match_command,0x169,0);
  Am_Value::Am_Value((Am_Value *)local_590,pAVar3);
  Am_Object::~Am_Object(&match_command);
  pAVar3 = Am_Object::Get(&local_18,Am_INVOKE_MATCH_COMMAND,0);
  Am_Object::Am_Object(&local_5a0,pAVar3);
  bVar2 = Am_Value::Valid((Am_Value *)local_590);
  if (bVar2) {
    bVar2 = Am_Object::Valid(&local_5a0);
    if (bVar2) {
      Am_Object::Set(&local_5a0,Am_BEFORE_OR_AFTER,(Am_Value *)local_590,1);
      Am_Object::Get_Object(&local_818,(Am_Slot_Key)&local_18,(ulong)Am_UNDO_SCROLL_GROUP);
      pAVar3 = Am_Object::Get(&local_818,0xa2,0);
      copy_values_to_match_command(&local_5a0,pAVar3);
      Am_Object::~Am_Object(&local_818);
      Am_Object::Set((Am_Object *)&accel_string,Am_BEFORE_OR_AFTER,(Am_Value *)local_590,0);
      AVar1 = Am_BEFORE_OR_AFTER_COMMAND;
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&local_5a0);
      Am_Object::Set((Am_Object *)&accel_string,AVar1,pAVar5,0);
      goto LAB_002b3e00;
    }
    std::ostrstream::ostrstream(local_810,local_6a8,0xfa,_S_out);
    poVar4 = std::operator<<((ostream *)local_810,
                             "For before/after command, need to use \"Load\" button.");
    std::ostream::operator<<(poVar4,std::ends<char,std::char_traits<char>>);
    Am_Pop_Up_Error_Window(local_6a8);
    std::ostrstream::~ostrstream(local_810);
  }
  else {
    bVar2 = Am_Object::Valid(&local_5a0);
    if (bVar2) {
      am_remove_match_command(&local_5a0);
      Am_Object::Set((Am_Object *)&accel_string,Am_BEFORE_OR_AFTER,0,0);
      AVar1 = Am_BEFORE_OR_AFTER_COMMAND;
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&Am_No_Object);
      Am_Object::Set((Am_Object *)&accel_string,AVar1,pAVar5,0);
    }
LAB_002b3e00:
    Am_Object::Am_Object(&local_820,&local_18);
    done_with_invoke_window(&local_820);
    Am_Object::~Am_Object(&local_820);
  }
  Am_Object::~Am_Object(&local_5a0);
  Am_Value::~Am_Value((Am_Value *)local_590);
LAB_002b3e4e:
  Am_String::~Am_String(&local_60);
  Am_Object::~Am_Object((Am_Object *)&accel_string);
  Am_Object::~Am_Object(&script_execute_command);
  Am_Object::~Am_Object(&window);
  Am_Object::~Am_Object(&sel_widget);
  Am_Object::~Am_Object(&undo_db);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_invoke_ok, (Am_Object cmd))
{
  Am_Object invoke_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object script_window = invoke_window.Get(Am_SCRIPT_WINDOW);
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Object sel_widget = undo_db.Get(Am_SELECTION_WIDGET);
  Am_Object window = sel_widget.Get(Am_WINDOW);
  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);

  // deal with accelerator char
  Am_String accel_string =
      invoke_window.Get_Object(Am_ACCELERATOR).Get(Am_VALUE);
  Am_Input_Char accel_char;
  if (invoke_window.Get_Object(Am_DO_ACCELERATOR).Get(Am_VALUE).Valid()) {
    if (accel_string != "") {
      accel_char = Am_Input_Char(accel_string, false);
      // check if this accelerator already in use
      Am_Object other_cmd =
          Am_Check_Accelerator_Char_For_Window(accel_char, window);
      if (other_cmd.Valid() && other_cmd != script_execute_command) {
        AM_POP_UP_ERROR_WINDOW(
            "Accelerator " << accel_char << " already in use by " << other_cmd);
        return; //don't make the window invisible if invalid
      }
    } else {
      AM_POP_UP_ERROR_WINDOW("To attach to accelerator, need to fill in key");
      return; //don't make the window invisible if invalid
    }
  }
  script_execute_command.Set(Am_ACCELERATOR, accel_char);

  // deal with before/after commands
  Am_Value before_after =
      invoke_window.Get_Object(Am_BEFORE_OR_AFTER).Get(Am_VALUE);
  Am_Object match_command = invoke_window.Get(Am_INVOKE_MATCH_COMMAND);
  if (before_after.Valid()) {
    if (!match_command.Valid()) {
      AM_POP_UP_ERROR_WINDOW(
          "For before/after command, need to use \"Load\" button.");
      return; //don't make the window invisible if invalid
    }
    match_command.Set(Am_BEFORE_OR_AFTER, before_after, Am_OK_IF_NOT_THERE);
    copy_values_to_match_command(
        match_command,
        invoke_window.Get_Object(Am_UNDO_SCROLL_GROUP).Get(Am_ITEMS));
    script_execute_command.Set(Am_BEFORE_OR_AFTER, before_after);
    script_execute_command.Set(Am_BEFORE_OR_AFTER_COMMAND, match_command);
  } else if (match_command.Valid()) {
    am_remove_match_command(match_command);
    script_execute_command.Set(Am_BEFORE_OR_AFTER, 0);
    script_execute_command.Set(Am_BEFORE_OR_AFTER_COMMAND, Am_No_Object);
  }
  done_with_invoke_window(invoke_window);
}